

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

int __thiscall re2::Compiler::AddSuffixRecursive(Compiler *this,int root,int id)

{
  uint uVar1;
  Inst *pIVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  Frag FVar6;
  uint uVar7;
  ulong uVar8;
  uint32_t uVar9;
  
  FVar6 = FindByteRange(this,root,id);
  uVar9 = FVar6.begin;
  if (uVar9 == 0) {
    uVar7 = AllocInst(this,1);
    if (-1 < (int)uVar7) {
      Prog::Inst::InitAlt((this->inst_).ptr_._M_t.
                          super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                          .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + uVar7,root
                          ,id);
      return uVar7;
    }
  }
  else {
    uVar8 = (ulong)FVar6 >> 0x20;
    uVar7 = root;
    if (uVar8 != 0) {
      pIVar2 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
      if ((uVar8 & 1) == 0) {
        uVar7 = pIVar2[(int)uVar9].out_opcode_ >> 4;
      }
      else {
        uVar7 = pIVar2[(int)uVar9].field_1.cap_;
      }
    }
    bVar3 = IsCachedRuneByteSuffix(this,uVar7);
    if (bVar3) {
      uVar4 = AllocInst(this,1);
      uVar1 = root;
      if (-1 < (int)uVar4) {
        pIVar2 = (this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
        Prog::Inst::InitByteRange
                  (pIVar2 + uVar4,(uint)pIVar2[(int)uVar7].field_1.field_3.lo_,
                   (uint)pIVar2[(int)uVar7].field_1.field_3.hi_,
                   pIVar2[(int)uVar7].field_1.field_3.hint_foldcase_ & 1,
                   pIVar2[(int)uVar7].out_opcode_ >> 4);
        uVar7 = uVar4;
        uVar1 = uVar4;
        if (uVar8 != 0) {
          pIVar2 = (this->inst_).ptr_._M_t.
                   super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                   _M_t.
                   super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                   .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
          if ((uVar8 & 1) == 0) {
            pIVar2[(int)uVar9].out_opcode_ = pIVar2[(int)uVar9].out_opcode_ & 0xf | uVar4 << 4;
            uVar1 = root;
          }
          else {
            pIVar2[(int)uVar9].field_1.cap_ = uVar4;
            uVar1 = root;
          }
        }
      }
      root = uVar1;
      if ((int)uVar4 < 0) {
        return 0;
      }
    }
    pIVar2 = (this->inst_).ptr_._M_t.
             super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
             super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
             super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
    uVar1 = pIVar2[id].out_opcode_;
    bVar3 = IsCachedRuneByteSuffix(this,id);
    if (!bVar3) {
      pIVar2 = pIVar2 + id;
      pIVar2->out_opcode_ = 0;
      pIVar2->field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)0x0;
      this->ninst_ = this->ninst_ + -1;
    }
    iVar5 = AddSuffixRecursive(this,(this->inst_).ptr_._M_t.
                                    super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                    .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl
                                    [(int)uVar7].out_opcode_ >> 4,uVar1 >> 4);
    if (iVar5 != 0) {
      pIVar2 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
      pIVar2[(int)uVar7].out_opcode_ = pIVar2[(int)uVar7].out_opcode_ & 0xf | iVar5 << 4;
      return root;
    }
  }
  return 0;
}

Assistant:

int Compiler::AddSuffixRecursive(int root, int id) {
  DCHECK(inst_[root].opcode() == kInstAlt ||
         inst_[root].opcode() == kInstByteRange);

  Frag f = FindByteRange(root, id);
  if (IsNoMatch(f)) {
    int alt = AllocInst(1);
    if (alt < 0)
      return 0;
    inst_[alt].InitAlt(root, id);
    return alt;
  }

  int br;
  if (f.end.p == 0)
    br = root;
  else if (f.end.p&1)
    br = inst_[f.begin].out1();
  else
    br = inst_[f.begin].out();

  if (IsCachedRuneByteSuffix(br)) {
    // We can't fiddle with cached suffixes, so make a clone of the head.
    int byterange = AllocInst(1);
    if (byterange < 0)
      return 0;
    inst_[byterange].InitByteRange(inst_[br].lo(), inst_[br].hi(),
                                   inst_[br].foldcase(), inst_[br].out());

    // Ensure that the parent points to the clone, not to the original.
    // Note that this could leave the head unreachable except via the cache.
    br = byterange;
    if (f.end.p == 0)
      root = br;
    else if (f.end.p&1)
      inst_[f.begin].out1_ = br;
    else
      inst_[f.begin].set_out(br);
  }

  int out = inst_[id].out();
  if (!IsCachedRuneByteSuffix(id)) {
    // The head should be the instruction most recently allocated, so free it
    // instead of leaving it unreachable.
    DCHECK_EQ(id, ninst_-1);
    inst_[id].out_opcode_ = 0;
    inst_[id].out1_ = 0;
    ninst_--;
  }

  out = AddSuffixRecursive(inst_[br].out(), out);
  if (out == 0)
    return 0;

  inst_[br].set_out(out);
  return root;
}